

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

const_iterator * __thiscall
plot::
Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
::cend(const_iterator *__return_storage_ptr__,
      Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
      *this)

{
  RealCanvas<plot::BrailleCanvas> *pRVar1;
  RealCanvas<plot::BrailleCanvas> *pRVar2;
  RealCanvas<plot::BrailleCanvas> *pRVar3;
  block_iterator local_880;
  block_iterator local_670;
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  local_460;
  
  local_880.line_.hbox_ = &this->block_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)&(this->block_).blocks_;
  pRVar1 = *(RealCanvas<plot::BrailleCanvas> **)
            ((long)&(this->block_).blocks_.
                    super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                    .
                    super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                    ._M_head_impl.blocks_.
                    super__Tuple_impl<0UL,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
            + 0x160);
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar1->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pRVar2 = *(RealCanvas<plot::BrailleCanvas> **)
            ((long)&(this->block_).blocks_.
                    super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
                    .
                    super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
                    ._M_head_impl.blocks_.
                    super__Tuple_impl<0UL,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
            + 0x98);
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar2->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.margin_ =
       (this->block_).blocks_.
       super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
       .
       super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.margin_;
  pRVar3 = (this->block_).blocks_.
           super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
           .super__Tuple_impl<1UL,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>.
           super__Head_base<1UL,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_false>.
           _M_head_impl.block_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar3->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_880.line_.margin_ = (this->block_).margin_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ = &pRVar3->canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.vbox_ =
       &(this->block_).blocks_.
        super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
        .
        super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
        ._M_head_impl;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)
       &(this->block_).blocks_.
        super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
        .
        super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
        ._M_head_impl.blocks_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ = &pRVar2->canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       (Frame<plot::RealCanvas<plot::BrailleCanvas>_*> *)
       ((long)&(this->block_).blocks_.
               super__Tuple_impl<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
               .
               super__Head_base<0UL,_plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
               ._M_head_impl.blocks_.
               super__Tuple_impl<0UL,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
       + 200);
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ = &pRVar1->canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar1->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar2->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       (pRVar3->canvas_).blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.overflow_ = 1;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.vbox_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.vbox_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.margin_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.margin_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_880.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.hbox_ = local_880.line_.hbox_;
  local_670.line_.margin_ = local_880.line_.margin_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.vbox_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.vbox_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.margin_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.margin_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.vbox_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.vbox_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.margin_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.margin_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.lines_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Tuple_impl<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<1UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.frame_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.frame_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.line_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.canvas_ =
       local_880.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.canvas_;
  local_670.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
  ._M_head_impl.line_.ends_.
  super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  .
  super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
  ._M_head_impl.line_.end_.line_.it_._M_current =
       local_670.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_false>
       ._M_head_impl.line_.lines_.
       super__Tuple_impl<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
       .
       super__Head_base<0UL,_plot::detail::block_iterator<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::detail::frame_line<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_false>
       ._M_head_impl.line_.line_.line_.it_._M_current;
  detail::
  margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>
  ::margin_line(&local_460,this,this->bottom_,&local_670,&local_880);
  detail::
  block_iterator<plot::Margin<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>,_plot::detail::margin_line<plot::HBox<plot::VBox<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>_>_>
  ::block_iterator(__return_storage_ptr__,&local_460);
  return __return_storage_ptr__;
}

Assistant:

const_iterator cend() const {
        return { { this, std::ptrdiff_t(bottom_), detail::block_traits<Block>::end(block_), detail::block_traits<Block>::end(block_) } };
    }